

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onepass.cc
# Opt level: O1

bool re2::AddQ(Instq *q,int id)

{
  bool bVar1;
  bool bVar2;
  
  bVar2 = true;
  if (id != 0) {
    bVar1 = SparseSetT<void>::contains(q,id);
    if (bVar1) {
      bVar2 = false;
    }
    else {
      SparseSetT<void>::InsertInternal(q,true,id);
    }
  }
  return bVar2;
}

Assistant:

static bool AddQ(Instq *q, int id) {
  if (id == 0)
    return true;
  if (q->contains(id))
    return false;
  q->insert(id);
  return true;
}